

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtreeview.cpp
# Opt level: O0

void QTreeView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  int iVar2;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QModelIndex *in_RDI;
  void *_v_1;
  void *_v;
  QTreeView *_t;
  QModelIndex *in_stack_ffffffffffffff98;
  QTreeView *in_stack_ffffffffffffffa0;
  QTreeView *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int *piVar3;
  QTreeView *in_stack_ffffffffffffffc0;
  QModelIndex *in_stack_ffffffffffffffc8;
  undefined1 enable;
  code *in_stack_ffffffffffffffd0;
  int depth;
  QModelIndex *in_stack_ffffffffffffffd8;
  
  if (in_ESI == 0) {
    iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    depth = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    switch((QModelIndex *)(ulong)in_EDX) {
    case (QModelIndex *)0x0:
      expanded(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      break;
    case (QModelIndex *)0x1:
      collapsed(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      break;
    case (QModelIndex *)0x2:
      hideColumn(in_stack_ffffffffffffffb0,0);
      break;
    case (QModelIndex *)0x3:
      showColumn(in_stack_ffffffffffffffb0,0);
      break;
    case (QModelIndex *)0x4:
      expand((QTreeView *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      break;
    case (QModelIndex *)0x5:
      collapse((QTreeView *)in_RCX,in_RDI);
      break;
    case (QModelIndex *)0x6:
      resizeColumnToContents(in_stack_ffffffffffffffc0,iVar2);
      break;
    case (QModelIndex *)0x7:
      sortByColumn(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (SortOrder)in_stack_ffffffffffffff98);
      break;
    case (QModelIndex *)0x8:
      expandAll(in_stack_ffffffffffffffa0);
      break;
    case (QModelIndex *)0x9:
      expandRecursively((QTreeView *)in_RDI,in_stack_ffffffffffffffd8,depth);
      break;
    case (QModelIndex *)0xa:
      expandRecursively((QTreeView *)in_RDI,in_stack_ffffffffffffffd8,depth);
      break;
    case (QModelIndex *)0xb:
      collapseAll((QTreeView *)in_stack_ffffffffffffffd0);
      break;
    case (QModelIndex *)0xc:
      expandToDepth((QTreeView *)in_RDI,0);
      break;
    case (QModelIndex *)0xd:
      columnResized(in_stack_ffffffffffffffc0,iVar2,(int)in_stack_ffffffffffffffb8,
                    (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
      break;
    case (QModelIndex *)0xe:
      columnCountChanged(in_stack_ffffffffffffffb0,0,in_EDX);
      break;
    case (QModelIndex *)0xf:
      columnMoved(in_stack_ffffffffffffffa0);
      break;
    case (QModelIndex *)0x10:
      reexpand((QTreeView *)in_RDI);
      break;
    case (QModelIndex *)0x11:
      rowsRemoved(in_stack_ffffffffffffffb0,(QModelIndex *)(ulong)in_EDX,
                  (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0);
      break;
    case (QModelIndex *)0x12:
      (**(code **)(*(long *)in_RDI + 0x280))(in_RDI,**(undefined4 **)(in_RCX + 8));
    }
  }
  enable = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  if (in_ESI == 5) {
    in_stack_ffffffffffffffd0 = expanded;
    bVar1 = QtMocHelpers::indexOfMethod<void(QTreeView::*)(QModelIndex_const&)>
                      (in_RCX,(void **)expanded,0,0);
    if (bVar1) {
      return;
    }
    enable = 0;
    bVar1 = QtMocHelpers::indexOfMethod<void(QTreeView::*)(QModelIndex_const&)>
                      (in_RCX,(void **)collapsed,0,1);
    if (bVar1) {
      return;
    }
  }
  if (in_ESI == 1) {
    piVar3 = *(int **)in_RCX;
    in_stack_ffffffffffffffa0 = (QTreeView *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffffa0) {
    case (QTreeView *)0x0:
      iVar2 = autoExpandDelay(in_stack_ffffffffffffffa0);
      *piVar3 = iVar2;
      break;
    case (QTreeView *)0x1:
      iVar2 = indentation(in_stack_ffffffffffffffa0);
      *piVar3 = iVar2;
      break;
    case (QTreeView *)0x2:
      bVar1 = rootIsDecorated(in_stack_ffffffffffffffa0);
      *(bool *)piVar3 = bVar1;
      break;
    case (QTreeView *)0x3:
      bVar1 = uniformRowHeights(in_stack_ffffffffffffffa0);
      *(bool *)piVar3 = bVar1;
      break;
    case (QTreeView *)0x4:
      bVar1 = itemsExpandable(in_stack_ffffffffffffffa0);
      *(bool *)piVar3 = bVar1;
      break;
    case (QTreeView *)0x5:
      bVar1 = isSortingEnabled(in_stack_ffffffffffffffa0);
      *(bool *)piVar3 = bVar1;
      break;
    case (QTreeView *)0x6:
      bVar1 = isAnimated(in_stack_ffffffffffffffa0);
      *(bool *)piVar3 = bVar1;
      break;
    case (QTreeView *)0x7:
      bVar1 = allColumnsShowFocus(in_stack_ffffffffffffffa0);
      *(bool *)piVar3 = bVar1;
      break;
    case (QTreeView *)0x8:
      bVar1 = wordWrap(in_stack_ffffffffffffffa0);
      *(bool *)piVar3 = bVar1;
      break;
    case (QTreeView *)0x9:
      bVar1 = isHeaderHidden(in_stack_ffffffffffffffa0);
      *(bool *)piVar3 = bVar1;
      break;
    case (QTreeView *)0xa:
      bVar1 = expandsOnDoubleClick(in_stack_ffffffffffffffa0);
      *(bool *)piVar3 = bVar1;
    }
  }
  if (in_ESI == 2) {
    switch(in_EDX) {
    case 0:
      setAutoExpandDelay(in_stack_ffffffffffffffa0,0);
      break;
    case 1:
      setIndentation(in_stack_ffffffffffffffa0,0);
      break;
    case 2:
      setRootIsDecorated(in_stack_ffffffffffffffa0,false);
      break;
    case 3:
      setUniformRowHeights(in_stack_ffffffffffffffa0,false);
      break;
    case 4:
      setItemsExpandable(in_stack_ffffffffffffffa0,false);
      break;
    case 5:
      setSortingEnabled((QTreeView *)in_stack_ffffffffffffffd0,(bool)enable);
      break;
    case 6:
      setAnimated(in_stack_ffffffffffffffa0,false);
      break;
    case 7:
      setAllColumnsShowFocus(in_stack_ffffffffffffffa0,false);
      break;
    case 8:
      setWordWrap(in_stack_ffffffffffffffa0,false);
      break;
    case 9:
      setHeaderHidden(in_stack_ffffffffffffffa0,false);
      break;
    case 10:
      setExpandsOnDoubleClick(in_stack_ffffffffffffffa0,false);
    }
  }
  if ((in_ESI == 3) && (in_EDX == 1)) {
    resetIndentation(in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void QTreeView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTreeView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->expanded((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->collapsed((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->hideColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->showColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->expand((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 5: _t->collapse((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 6: _t->resizeColumnToContents((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->sortByColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 8: _t->expandAll(); break;
        case 9: _t->expandRecursively((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->expandRecursively((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 11: _t->collapseAll(); break;
        case 12: _t->expandToDepth((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 13: _t->columnResized((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->columnCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 15: _t->columnMoved(); break;
        case 16: _t->reexpand(); break;
        case 17: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 18: _t->verticalScrollbarValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTreeView::*)(const QModelIndex & )>(_a, &QTreeView::expanded, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeView::*)(const QModelIndex & )>(_a, &QTreeView::collapsed, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->autoExpandDelay(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->indentation(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->rootIsDecorated(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->uniformRowHeights(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->itemsExpandable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isAnimated(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->allColumnsShowFocus(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isHeaderHidden(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->expandsOnDoubleClick(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoExpandDelay(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setIndentation(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setRootIsDecorated(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setUniformRowHeights(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setItemsExpandable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setAnimated(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setAllColumnsShowFocus(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setHeaderHidden(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setExpandsOnDoubleClick(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->resetIndentation(); break;
        default: break;
        }
    }
}